

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

int av1_is_leaf_split_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  ulong uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  int iVar3;
  uint uVar4;
  BLOCK_SIZE BVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  iVar2 = (int)CONCAT71(in_register_00000009,bsize);
  uVar6 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  BVar5 = BLOCK_INVALID;
  switch(uVar6) {
  case 0:
    uVar1 = uVar6;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_00a0a1bd_caseD_1;
  case 3:
    uVar1 = 1;
    break;
  case 6:
    uVar1 = 2;
    break;
  case 9:
    uVar1 = 3;
    break;
  default:
    if (iVar2 == 0xc) {
      uVar1 = 4;
    }
    else {
      if (iVar2 != 0xf) goto switchD_00a0a1bd_caseD_1;
      uVar1 = 5;
    }
  }
  BVar5 = subsize_lookup[3][uVar1];
switchD_00a0a1bd_caseD_1:
  iVar2 = (cm->mi_params).mi_rows;
  uVar7 = 0;
  if (mi_row < iVar2) {
    uVar7 = 0;
    bVar8 = false;
    iVar3 = mi_row;
    do {
      uVar4 = 0;
      if ((uVar7 & 1) != 0) {
        uVar4 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [uVar6] >> 1);
      }
      if (((cm->mi_params).mi_cols <= (int)(uVar4 + mi_col)) ||
         (((BVar5 != BLOCK_8X8 &&
           ((cm->mi_params).mi_grid_base[(int)(iVar3 * (cm->mi_params).mi_stride + uVar4 + mi_col)]
            ->bsize != BVar5)) || (bVar8 = 2 < uVar7, uVar7 == 3)))) break;
      uVar7 = uVar7 + 1;
      iVar3 = (uVar7 >> 1) *
              (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar6] >> 1) + mi_row;
    } while (iVar3 < iVar2);
    uVar7 = (uint)bVar8;
  }
  return uVar7;
}

Assistant:

int av1_is_leaf_split_partition(AV1_COMMON *cm, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  assert(bsize >= BLOCK_8X8);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);

  for (int i = 0; i < 4; i++) {
    int x_idx = (i & 1) * hbs;
    int y_idx = (i >> 1) * hbs;
    if ((mi_row + y_idx >= cm->mi_params.mi_rows) ||
        (mi_col + x_idx >= cm->mi_params.mi_cols))
      return 0;
    if (get_partition(cm, mi_row + y_idx, mi_col + x_idx, subsize) !=
            PARTITION_NONE &&
        subsize != BLOCK_8X8)
      return 0;
  }
  return 1;
}